

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

int socket_connect(char *host,char *port)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  char *pcVar3;
  addrinfo *res;
  int on;
  linger lng;
  addrinfo local_48;
  
  lng.l_onoff = 0;
  lng.l_linger = 0;
  res = (addrinfo *)0x0;
  on = 1;
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 0;
  iVar1 = getaddrinfo(host,port,&local_48,(addrinfo **)&res);
  __stream = _stderr;
  if (iVar1 == 0) {
    iVar1 = socket(res->ai_family,res->ai_socktype,res->ai_protocol);
    if (iVar1 == -1) {
      pcVar3 = "socket";
    }
    else {
      iVar2 = setsockopt(iVar1,1,2,&on,4);
      if ((iVar2 == -1) || (iVar2 = setsockopt(iVar1,1,0xd,&lng,8), iVar2 == -1)) {
        pcVar3 = "setsockopt";
      }
      else {
        iVar2 = connect(iVar1,(sockaddr *)res->ai_addr,res->ai_addrlen);
        if (iVar2 == 0) {
          freeaddrinfo((addrinfo *)res);
          return iVar1;
        }
        pcVar3 = "connect";
      }
    }
    perror(pcVar3);
    freeaddrinfo((addrinfo *)res);
  }
  else {
    pcVar3 = gai_strerror(iVar1);
    fprintf(__stream,"can\'t resolve %s:%s: %s\n",host,port,pcVar3);
  }
  return -1;
}

Assistant:

static int socket_connect(const char *host, const char *port)
{
#define __err_connect(func) do { perror(func); freeaddrinfo(res); return -1; } while (0)

	int ai_err, on = 1, fd;
	struct linger lng = { 0, 0 };
	struct addrinfo hints, *res = 0;
	memset(&hints, 0, sizeof(struct addrinfo));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	/* In Unix/Mac, getaddrinfo() is the most convenient way to get
	 * server information. */
	if ((ai_err = getaddrinfo(host, port, &hints, &res)) != 0) { fprintf(stderr, "can't resolve %s:%s: %s\n", host, port, gai_strerror(ai_err)); return -1; }
	if ((fd = socket(res->ai_family, res->ai_socktype, res->ai_protocol)) == -1) __err_connect("socket");
	/* The following two setsockopt() are used by ftplib
	 * (http://nbpfaus.net/~pfau/ftplib/). I am not sure if they
	 * necessary. */
	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) == -1) __err_connect("setsockopt");
	if (setsockopt(fd, SOL_SOCKET, SO_LINGER, &lng, sizeof(lng)) == -1) __err_connect("setsockopt");
	if (connect(fd, res->ai_addr, res->ai_addrlen) != 0) __err_connect("connect");
	freeaddrinfo(res);
	return fd;
}